

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprIfTrue(Parse *pParse,Expr *pExpr,int dest,int jumpIfNull)

{
  byte bVar1;
  Vdbe *p;
  uint op;
  int iVar2;
  int iVar3;
  Expr *pEVar4;
  bool bVar5;
  int regFree1;
  int regFree2;
  ulong local_38;
  
  p = pParse->pVdbe;
  regFree1 = 0;
  regFree2 = 0;
  if (pExpr == (Expr *)0x0 || p == (Vdbe *)0x0) {
    return;
  }
  bVar1 = pExpr->op;
  op = (uint)bVar1;
  switch(bVar1) {
  case 0x2b:
    sqlite3ExprIfTrue(pParse,pExpr->pLeft,dest,jumpIfNull);
    pEVar4 = pExpr->pRight;
LAB_0016876d:
    sqlite3ExprIfTrue(pParse,pEVar4,dest,jumpIfNull);
    break;
  case 0x2c:
    iVar3 = pParse->nLabel + -1;
    pParse->nLabel = iVar3;
    sqlite3ExprIfFalse(pParse,pExpr->pLeft,iVar3,jumpIfNull ^ 0x10);
    sqlite3ExprIfTrue(pParse,pExpr->pRight,dest,jumpIfNull);
    goto LAB_0016879d;
  case 0x2d:
switchD_001685b0_caseD_2d:
    op = op == 0x2d | 0x34;
    jumpIfNull = 0x80;
    goto LAB_0016864b;
  case 0x2e:
  case 0x2f:
    goto switchD_001685b0_caseD_2e;
  case 0x30:
    exprCodeBetween(pParse,pExpr,dest,sqlite3ExprIfTrue,jumpIfNull);
    break;
  case 0x31:
    iVar3 = pParse->nLabel + -1;
    pParse->nLabel = iVar3;
    iVar2 = dest;
    if (jumpIfNull == 0) {
      iVar2 = iVar3;
    }
    sqlite3ExprCodeIN(pParse,pExpr,iVar3,iVar2);
    sqlite3VdbeGoto(p,dest);
LAB_0016879d:
    sqlite3VdbeResolveLabel(p,iVar3);
    break;
  case 0x32:
  case 0x33:
    iVar2 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    sqlite3VdbeAddOp2(p,op,iVar2,dest);
    break;
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
LAB_0016864b:
    pEVar4 = pExpr->pLeft;
    local_38 = (ulong)(uint)dest;
    iVar2 = sqlite3ExprIsVector(pEVar4);
    if (iVar2 == 0) {
      iVar2 = sqlite3ExprCodeTemp(pParse,pEVar4,&regFree1);
      iVar3 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
      codeCompare(pParse,pExpr->pLeft,pExpr->pRight,op,iVar2,iVar3,(int)local_38,jumpIfNull);
    }
    else {
      dest = (int)local_38;
switchD_001685b0_caseD_2e:
      iVar2 = exprAlwaysTrue(pExpr);
      if (iVar2 == 0) {
        iVar2 = exprAlwaysFalse(pExpr);
        if (iVar2 == 0) {
          iVar2 = sqlite3ExprCodeTemp(pParse,pExpr,&regFree1);
          sqlite3VdbeAddOp3(p,0x12,iVar2,dest,(uint)(jumpIfNull != 0));
        }
      }
      else {
        sqlite3VdbeGoto(p,dest);
      }
    }
    break;
  default:
    if (bVar1 == 0x13) {
      pEVar4 = pExpr->pLeft;
    }
    else {
      if (bVar1 == 0xa0) goto switchD_001685b0_caseD_2d;
      if (op != 0xa7) goto switchD_001685b0_caseD_2e;
      bVar5 = pExpr->op2 == 0xa0;
      pEVar4 = pExpr->pLeft;
      jumpIfNull = (uint)bVar5 << 4;
      if (((pExpr->pRight->u).zToken[4] != '\0') == bVar5) goto LAB_0016876d;
    }
    sqlite3ExprIfFalse(pParse,pEVar4,dest,jumpIfNull);
  }
  if (regFree1 != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = regFree1;
    }
  }
  if (regFree2 != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = regFree2;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprIfTrue(Parse *pParse, Expr *pExpr, int dest, int jumpIfNull){
  Vdbe *v = pParse->pVdbe;
  int op = 0;
  int regFree1 = 0;
  int regFree2 = 0;
  int r1, r2;

  assert( jumpIfNull==SQLITE_JUMPIFNULL || jumpIfNull==0 );
  if( NEVER(v==0) )     return;  /* Existence of VDBE checked by caller */
  if( NEVER(pExpr==0) ) return;  /* No way this can happen */
  op = pExpr->op;
  switch( op ){
    case TK_AND: {
      int d2 = sqlite3VdbeMakeLabel(pParse);
      testcase( jumpIfNull==0 );
      sqlite3ExprIfFalse(pParse, pExpr->pLeft, d2,jumpIfNull^SQLITE_JUMPIFNULL);
      sqlite3ExprIfTrue(pParse, pExpr->pRight, dest, jumpIfNull);
      sqlite3VdbeResolveLabel(v, d2);
      break;
    }
    case TK_OR: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest, jumpIfNull);
      sqlite3ExprIfTrue(pParse, pExpr->pRight, dest, jumpIfNull);
      break;
    }
    case TK_NOT: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest, jumpIfNull);
      break;
    }
    case TK_TRUTH: {
      int isNot;      /* IS NOT TRUE or IS NOT FALSE */
      int isTrue;     /* IS TRUE or IS NOT TRUE */
      testcase( jumpIfNull==0 );
      isNot = pExpr->op2==TK_ISNOT;
      isTrue = sqlite3ExprTruthValue(pExpr->pRight);
      testcase( isTrue && isNot );
      testcase( !isTrue && isNot );
      if( isTrue ^ isNot ){
        sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest,
                          isNot ? SQLITE_JUMPIFNULL : 0);
      }else{
        sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest,
                           isNot ? SQLITE_JUMPIFNULL : 0);
      }
      break;
    }
    case TK_IS:
    case TK_ISNOT:
      testcase( op==TK_IS );
      testcase( op==TK_ISNOT );
      op = (op==TK_IS) ? TK_EQ : TK_NE;
      jumpIfNull = SQLITE_NULLEQ;
      /* Fall thru */
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      if( sqlite3ExprIsVector(pExpr->pLeft) ) goto default_expr;
      testcase( jumpIfNull==0 );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, dest, jumpIfNull);
      assert(TK_LT==OP_Lt); testcase(op==OP_Lt); VdbeCoverageIf(v,op==OP_Lt);
      assert(TK_LE==OP_Le); testcase(op==OP_Le); VdbeCoverageIf(v,op==OP_Le);
      assert(TK_GT==OP_Gt); testcase(op==OP_Gt); VdbeCoverageIf(v,op==OP_Gt);
      assert(TK_GE==OP_Ge); testcase(op==OP_Ge); VdbeCoverageIf(v,op==OP_Ge);
      assert(TK_EQ==OP_Eq); testcase(op==OP_Eq);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull==SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Eq && jumpIfNull!=SQLITE_NULLEQ);
      assert(TK_NE==OP_Ne); testcase(op==OP_Ne);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull==SQLITE_NULLEQ);
      VdbeCoverageIf(v, op==OP_Ne && jumpIfNull!=SQLITE_NULLEQ);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      assert( TK_ISNULL==OP_IsNull );   testcase( op==TK_ISNULL );
      assert( TK_NOTNULL==OP_NotNull ); testcase( op==TK_NOTNULL );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      sqlite3VdbeAddOp2(v, op, r1, dest);
      VdbeCoverageIf(v, op==TK_ISNULL);
      VdbeCoverageIf(v, op==TK_NOTNULL);
      testcase( regFree1==0 );
      break;
    }
    case TK_BETWEEN: {
      testcase( jumpIfNull==0 );
      exprCodeBetween(pParse, pExpr, dest, sqlite3ExprIfTrue, jumpIfNull);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_IN: {
      int destIfFalse = sqlite3VdbeMakeLabel(pParse);
      int destIfNull = jumpIfNull ? dest : destIfFalse;
      sqlite3ExprCodeIN(pParse, pExpr, destIfFalse, destIfNull);
      sqlite3VdbeGoto(v, dest);
      sqlite3VdbeResolveLabel(v, destIfFalse);
      break;
    }
#endif
    default: {
    default_expr:
      if( exprAlwaysTrue(pExpr) ){
        sqlite3VdbeGoto(v, dest);
      }else if( exprAlwaysFalse(pExpr) ){
        /* No-op */
      }else{
        r1 = sqlite3ExprCodeTemp(pParse, pExpr, &regFree1);
        sqlite3VdbeAddOp3(v, OP_If, r1, dest, jumpIfNull!=0);
        VdbeCoverage(v);
        testcase( regFree1==0 );
        testcase( jumpIfNull==0 );
      }
      break;
    }
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);  
}